

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void R_SetupFreelook(void)

{
  double dVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float local_28;
  float cy;
  float den;
  float focus;
  int i;
  int e;
  double local_10;
  double dy;
  
  dVar1 = FocalLengthY;
  if (camera == (AActor *)0x0) {
    local_10 = 0.0;
  }
  else {
    TAngle<double>::operator-((TAngle<double> *)&i);
    local_10 = TAngle<double>::Tan((TAngle<double> *)&i);
    local_10 = dVar1 * local_10;
  }
  CenterY = (double)viewheight / 2.0 + local_10;
  centery = xs_ToInt((real64)CenterY,-0.499999985);
  iVar2 = viewheight;
  globaluclip = -CenterY / InvZtoScale;
  globaldclip = ((double)viewheight - CenterY) / InvZtoScale;
  den = 0.0;
  fVar3 = (float)FocalLengthY;
  fVar4 = (float)CenterY;
  if (centery < 1) {
    local_28 = (0.0 - fVar4) + 0.5;
    do {
      yslope[(int)den] = fVar3 / local_28;
      local_28 = local_28 + 1.0;
      den = (float)((int)den + 1);
    } while ((int)den < iVar2);
  }
  else {
    local_28 = (fVar4 - 0.0) - 0.5;
    if (centery < viewheight) {
      do {
        yslope[(int)den] = fVar3 / local_28;
        local_28 = local_28 - 1.0;
        den = (float)((int)den + 1);
      } while ((int)den < centery);
      local_28 = ((float)(int)den - fVar4) + 0.5;
      do {
        yslope[(int)den] = fVar3 / local_28;
        local_28 = local_28 + 1.0;
        den = (float)((int)den + 1);
      } while ((int)den < iVar2);
    }
    else {
      do {
        yslope[(int)den] = fVar3 / local_28;
        local_28 = local_28 - 1.0;
        den = (float)((int)den + 1);
      } while ((int)den < iVar2);
    }
  }
  return;
}

Assistant:

void R_SetupFreelook()
{
	double dy;
		
	if (camera != NULL)
	{
		dy = FocalLengthY * (-ViewPitch).Tan();
	}
	else
	{
		dy = 0;
	}

	CenterY = (viewheight / 2.0) + dy;
	centery = xs_ToInt(CenterY);
	globaluclip = -CenterY / InvZtoScale;
	globaldclip = (viewheight - CenterY) / InvZtoScale;

	//centeryfrac &= 0xffff0000;
	int e, i;

	i = 0;
	e = viewheight;
	float focus = float(FocalLengthY);
	float den;
	float cy = float(CenterY);
	if (i < centery)
	{
		den = cy - i - 0.5f;
		if (e <= centery)
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < e);
		}
		else
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < centery);
			den = i - cy + 0.5f;
			do {
				yslope[i] = focus / den;
				den += 1;
			} while (++i < e);
		}
	}
	else
	{
		den = i - cy + 0.5f;
		do {
			yslope[i] = focus / den;
			den += 1;
		} while (++i < e);
	}
}